

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_js_generator.cc
# Opt level: O3

void __thiscall
t_js_generator::generate_serialize_map_element
          (t_js_generator *this,ostream *out,t_map *tmap,string *kiter,string *viter)

{
  t_type *ptVar1;
  pointer pcVar2;
  t_field vfield;
  t_field kfield;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  t_field local_190;
  t_field local_e0;
  
  ptVar1 = tmap->key_type_;
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  pcVar2 = (kiter->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_210,pcVar2,pcVar2 + kiter->_M_string_length);
  t_field::t_field(&local_e0,ptVar1,&local_210);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p);
  }
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"");
  generate_serialize_field(this,out,&local_e0,&local_1b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p);
  }
  ptVar1 = tmap->val_type_;
  pcVar2 = (viter->_M_dataplus)._M_p;
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1d0,pcVar2,pcVar2 + viter->_M_string_length);
  t_field::t_field(&local_190,ptVar1,&local_1d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p);
  }
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"");
  generate_serialize_field(this,out,&local_190,&local_1f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p);
  }
  t_field::~t_field(&local_190);
  t_field::~t_field(&local_e0);
  return;
}

Assistant:

void t_js_generator::generate_serialize_map_element(ostream& out,
                                                    t_map* tmap,
                                                    string kiter,
                                                    string viter) {
  t_field kfield(tmap->get_key_type(), kiter);
  generate_serialize_field(out, &kfield);

  t_field vfield(tmap->get_val_type(), viter);
  generate_serialize_field(out, &vfield);
}